

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O1

void userLoop(Simulator *sim)

{
  short sVar1;
  int iVar2;
  Timer *pTVar3;
  uint uVar4;
  MySimulator *this;
  short sVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Timer *pTVar10;
  Timer *pTVar11;
  
  this = (MySimulator *)
         __dynamic_cast(sim,&brown::Simulator::typeinfo,&brown::MySimulator::typeinfo,0);
  if (((this != (MySimulator *)0x0) && (r1step < 1)) && (r2step < 1)) {
    if (0x294 < userLoop::ptIdx) {
      brown::MySimulator::delay(this,0);
      return;
    }
    if (userLoop::ptIdx != 0) {
      brown::MySimulator::delay(this,(long)sim->MAXT);
    }
    sVar1 = state[userLoop::ptIdx][1];
    sVar5 = sVar1 + 7;
    if (-1 < sVar1) {
      sVar5 = sVar1;
    }
    sVar1 = state[userLoop::ptIdx][2];
    sVar6 = sVar1 + 7;
    if (-1 < sVar1) {
      sVar6 = sVar1;
    }
    uVar9 = ((int)sVar5 >> 3) - _ZZL8userLoopRN5brown9SimulatorEE4locs_0;
    uVar7 = ((int)sVar6 >> 3) - _ZZL8userLoopRN5brown9SimulatorEE4locs_1;
    if (uVar7 != 0 || uVar9 != 0) {
      this->dirx = 0 < (int)uVar9;
      this->diry = 0 < (int)uVar7;
      this->isDown = state[userLoop::ptIdx][0] != 0;
      uVar4 = -uVar9;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      uVar9 = -uVar7;
      if (0 < (int)uVar7) {
        uVar9 = uVar7;
      }
      isxmain = uVar9 < uVar4;
      uVar7 = uVar9;
      if (uVar9 < uVar4) {
        uVar7 = uVar4;
      }
      uVar8 = uVar9;
      if (uVar4 < uVar9) {
        uVar8 = uVar4;
      }
      iVar2 = (this->super_Simulator).PULPERPIX;
      r1step = uVar7 * iVar2;
      r2step = iVar2 * uVar8;
      if (uVar8 == 0) {
        tg = -1.0;
      }
      else {
        tg = (float)r1step / (float)r2step;
      }
      pTVar10 = this->timx;
      pTVar3 = this->timy;
      pTVar11 = pTVar3;
      if (uVar9 < uVar4) {
        pTVar11 = pTVar10;
      }
      pTVar11->period = 0;
      pTVar11->isRunning = true;
      if (uVar8 != 0) {
        if (uVar9 < uVar4) {
          pTVar10 = pTVar3;
        }
        pTVar10->period = 0;
        pTVar10->isRunning = true;
      }
    }
    userLoop::ptIdx = userLoop::ptIdx + 1;
    _ZZL8userLoopRN5brown9SimulatorEE4locs_0 = (int)sVar5 >> 3;
    _ZZL8userLoopRN5brown9SimulatorEE4locs_1 = (int)sVar6 >> 3;
  }
  return;
}

Assistant:

static void userLoop(brown::Simulator& sim) {
    auto* psim = dynamic_cast<brown::MySimulator*>(&sim);
    if (!psim) {return;}
    brown::MySimulator& msim = *psim;

    // return if still drawing
    if (r1step > 0 || r2step > 0) {
        return;
    }

    // drawing finished, do nothing
    static constexpr std::size_t ptNum = sizeof(state)/sizeof(state[0]);
    static std::size_t ptIdx = 0;
    if (ptIdx >= ptNum) {
        msim.delay(0);
        return;
    }

    // delay between lines
    if (ptIdx > 0) {
        msim.delay(sim.MAXT);
    }

    // target location [px]
    static int scale = 8;
    int x = state[ptIdx][1]/scale;
    int y = state[ptIdx][2]/scale;
    bool isDown = static_cast<bool>(state[ptIdx][0]);

    // relative linear motion
    static int locs[2]{0, 0};
    int dx = x - locs[0];
    int dy = y - locs[1];
    moveLinear(msim, dx, dy, isDown);

    // update meta
    locs[0] = x; locs[1] = y;
    ptIdx++;
}